

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xinput.c
# Opt level: O2

xcb_generic_iterator_t xcb_input_input_state_end(xcb_input_input_state_iterator_t i)

{
  ulong in_RSI;
  xcb_input_input_state_t *in_RDI;
  long in_FS_OFFSET;
  xcb_generic_iterator_t xVar1;
  xcb_input_input_state_iterator_t local_20;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_20.data = in_RDI;
  local_20._8_8_ = in_RSI;
  while (0 < (int)in_RSI) {
    xcb_input_input_state_next(&local_20);
    in_RSI = local_20._8_8_ & 0xffffffff;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    xVar1._8_8_ = in_RSI & 0xffffffff | local_20._8_8_ & 0xffffffff00000000;
    xVar1.data = local_20.data;
    return xVar1;
  }
  __stack_chk_fail();
}

Assistant:

xcb_generic_iterator_t
xcb_input_input_state_end (xcb_input_input_state_iterator_t i)
{
    xcb_generic_iterator_t ret;
    while(i.rem > 0)
        xcb_input_input_state_next(&i);
    ret.data = i.data;
    ret.rem = i.rem;
    ret.index = i.index;
    return ret;
}